

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void issue457(void)

{
  roaring_bitmap_t *expression;
  roaring_bitmap_t *r;
  roaring_bitmap_t *unaff_retaddr;
  roaring_bitmap_t *r2;
  roaring_bitmap_t *r1;
  uint32_t in_stack_0000001c;
  uint64_t in_stack_00000020;
  uint64_t in_stack_00000028;
  int64_t in_stack_00000060;
  roaring_bitmap_t *in_stack_00000068;
  int in_stack_ffffffffffffffec;
  char *in_stack_fffffffffffffff0;
  
  expression = roaring_bitmap_from_range(in_stack_00000028,in_stack_00000020,in_stack_0000001c);
  roaring_bitmap_printf_describe(unaff_retaddr);
  roaring_bitmap_get_cardinality(unaff_retaddr);
  _assert_true((unsigned_long)unaff_retaddr,(char *)expression,in_stack_fffffffffffffff0,
               in_stack_ffffffffffffffec);
  r = roaring_bitmap_add_offset(in_stack_00000068,in_stack_00000060);
  roaring_bitmap_printf_describe(unaff_retaddr);
  roaring_bitmap_get_cardinality(unaff_retaddr);
  _assert_true((unsigned_long)unaff_retaddr,(char *)expression,(char *)r,in_stack_ffffffffffffffec);
  roaring_bitmap_printf(r);
  roaring_bitmap_free((roaring_bitmap_t *)0x10b76d);
  roaring_bitmap_free((roaring_bitmap_t *)0x10b777);
  return;
}

Assistant:

DEFINE_TEST(issue457) {
    roaring_bitmap_t *r1 = roaring_bitmap_from_range(65539, 65541, 1);
    roaring_bitmap_printf_describe(r1);
    assert_true(roaring_bitmap_get_cardinality(r1) == 2);
    roaring_bitmap_t *r2 = roaring_bitmap_add_offset(r1, -3);
    roaring_bitmap_printf_describe(r2);
    assert_true(roaring_bitmap_get_cardinality(r2) == 2);
    roaring_bitmap_printf(r2);
    roaring_bitmap_free(r1);
    roaring_bitmap_free(r2);
}